

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_index_equalorlarger(run_container_t *arr,uint16_t x)

{
  int32_t lenarray;
  rle16_t *array;
  uint uVar1;
  uint uVar2;
  
  array = arr->runs;
  lenarray = arr->n_runs;
  uVar1 = interleavedBinarySearch(array,lenarray,x);
  uVar2 = uVar1;
  if ((int)uVar1 < 0) {
    if ((uVar1 != 0xffffffff) &&
       (uVar2 = -uVar1 - 2,
       (int)((uint)x - (uint)array[uVar2].value) <= (int)(uint)array[uVar2].length)) {
      return uVar2;
    }
    uVar2 = 0xffffffff;
    if ((int)~uVar1 < lenarray) {
      uVar2 = ~uVar1;
    }
  }
  return uVar2;
}

Assistant:

inline int run_container_index_equalorlarger(const run_container_t *arr, uint16_t x) {
    int32_t index = interleavedBinarySearch(arr->runs, arr->n_runs, x);
    if (index >= 0) return index;
    index = -index - 2;  // points to preceding run, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = x - arr->runs[index].value;
        int32_t le = arr->runs[index].length;
        if (offset <= le) return index;
    }
    index += 1;
    if(index  < arr->n_runs) {
      return index;
    }
    return -1;
}